

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3stm.cpp
# Opt level: O1

void __thiscall CTPNStmImplicitCtor::gen_code(CTPNStmImplicitCtor *this,int param_1,int param_2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  CTcGenTarg *pCVar4;
  ulong in_RAX;
  CTcSymbol *pCVar5;
  size_t __n;
  CTPNSuperclass *this_00;
  ulong uStack_38;
  
  this_00 = (((this->super_CTPNStmImplicitCtorBase).obj_stm_)->super_CTPNStmObjectBase).
            super_CTPNObjDef.sclist_.head_;
  if (this_00 != (CTPNSuperclass *)0x0) {
    uStack_38 = in_RAX;
    do {
      pCVar5 = CTPNSuperclass::get_sym(this_00);
      if ((pCVar5 != (CTcSymbol *)0x0) &&
         (*(int *)&(pCVar5->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24
          == 2)) {
        CTcGenTarg::write_op(G_cg,'\x01');
        pCVar4 = G_cg;
        iVar2 = G_cg->sp_depth_;
        iVar1 = iVar2 + 1;
        G_cg->sp_depth_ = iVar1;
        if (pCVar4->max_sp_depth_ <= iVar2) {
          pCVar4->max_sp_depth_ = iVar1;
        }
        CTcSymLocal::s_gen_code_getlcl(0,0);
        CTcGenTarg::write_op(G_cg,'\x0e');
        pCVar4 = G_cg;
        uVar3 = G_cg->sp_depth_;
        __n = (size_t)uVar3;
        G_cg->sp_depth_ = uVar3 + 1;
        if (pCVar4->max_sp_depth_ <= (int)uVar3) {
          pCVar4->max_sp_depth_ = uVar3 + 1;
        }
        pCVar4->sp_depth_ = pCVar4->sp_depth_ + -1;
        CTcGenTarg::write_op(pCVar4,'v');
        CTcGenTarg::write_op(G_cg,'t');
        uStack_38 = uStack_38 & 0xffffffffffffff;
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&uStack_38 + 7,(void *)0x1,__n);
        CTcDataStream::write_prop_id(&G_cs->super_CTcDataStream,G_prs->constructor_prop_);
        CTcDataStream::write_obj_id
                  (&G_cs->super_CTcDataStream,
                   (ulong)pCVar5[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                          _vptr_CVmHashEntry);
        G_cg->sp_depth_ = G_cg->sp_depth_ + -2;
      }
      this_00 = this_00->nxt_;
    } while (this_00 != (CTPNSuperclass *)0x0);
  }
  return;
}

Assistant:

void CTPNStmImplicitCtor::gen_code(int /*discard*/, int /*for_condition*/)
{
    /* 
     *   Generate a call to inherit each superclass constructor.  Pass the
     *   same argument list we received by expanding the varargs list
     *   parameter in local 0.  
     */
    for (CTPNSuperclass *sc = obj_stm_->get_first_sc() ; sc != 0 ;
         sc = sc->nxt_)
    {
        /* 
         *   if this one is valid, generate code to call its constructor -
         *   it's valid if it has an object symbol 
         */
        CTcSymObj *sc_sym = (CTcSymObj *)sc->get_sym();
        if (sc_sym != 0 && sc_sym->get_type() == TC_SYM_OBJ)
        {
            /* push the argument counter so far (no other arguments) */
            G_cg->write_op(OPC_PUSH_0);
            G_cg->note_push();

            /* get the varargs list local */
            CTcSymLocal::s_gen_code_getlcl(0, FALSE);

            /* convert it to varargs */
            G_cg->write_op(OPC_MAKELSTPAR);

            /* note the extra push and pop for the argument count */
            G_cg->note_push();
            G_cg->note_pop();

            /* it's a varargs call */
            G_cg->write_op(OPC_VARARGC);

            /* generate an EXPINHERIT to this superclass */
            G_cg->write_op(OPC_EXPINHERIT);
            G_cs->write(0);                      /* varargs -> argc ignored */
            G_cs->write_prop_id(G_prs->get_constructor_prop());
            G_cs->write_obj_id(sc_sym->get_obj_id());

            /* 
             *   this removes arguments (the varargs list variable and
             *   argument count) 
             */
            G_cg->note_pop(2);
        }
    }
}